

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4m.cpp
# Opt level: O2

bool WriteD4M(FILE *param_1,shared_ptr<Disk> *param_2)

{
  logic_error *this;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"D4M writing not implemented");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool WriteD4M(FILE* /*f_*/, std::shared_ptr<Disk>&/*disk*/)
{
    throw std::logic_error("D4M writing not implemented");
#if 0
    auto missing = 0;
    bool f = true;

    PCFORMAT pf_ = &fmtD4M;
    auto cyls = D4M_TRACKS;
    auto heads = D4M_SIDES;

    MEMORY mem(D4M_TRACK_SIZE);

    for (auto cyl = 0; f && cyl < cyls; cyl++)
    {
        for (auto head = heads - 1; f && head >= 0; head--)
        {
            missing += pd_->ReadRegularTrack(cyl, head, pf_, mem);
            f = (fwrite(mem, D4M_SECTOR_SIZE, pf_->sectors, f_) == pf_->sectors);
        }
    }

    if (!f)
        throw util::exception("write error");

    if (missing)
        Message(msgWarning, "source missing %d/%d sectors", missing, cyls * heads * pf_->sectors);

    return true;
#endif
}